

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiEigenSolver<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  uint j_1;
  uint i_1;
  Matrix33<float> MA;
  uint j;
  uint i;
  Matrix33<float> MS;
  Matrix33<float> V;
  TV S;
  Matrix33<float> AA;
  T threshold;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  float fVar7;
  float in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  BaseType_conflict2 in_stack_ffffffffffffff3c;
  Matrix33<float> *in_stack_ffffffffffffff40;
  Matrix33<float> local_b0;
  uint local_8c;
  uint local_88;
  Matrix33<float> local_84;
  Matrix33<float> local_60;
  Vec3<float> local_3c;
  Matrix33<float> local_30;
  BaseType_conflict2 local_c;
  Matrix33<float> *local_8;
  
  local_8 = in_RDI;
  local_c = computeThreshold<Imath_3_2::Matrix33<float>>
                      ((Matrix33<float> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  Imath_3_2::Matrix33<float>::Matrix33(&local_30,local_8);
  Imath_3_2::Vec3<float>::Vec3(&local_3c);
  Imath_3_2::Matrix33<float>::Matrix33(&local_60);
  Imath_3_2::jacobiEigenSolver<float>
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (Matrix33<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  verifyOrthonormal<Imath_3_2::Matrix33<float>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)
  ;
  pMVar6 = &local_60;
  Imath_3_2::Matrix33<float>::determinant(pMVar6);
  std::abs((int)pMVar6);
  if (local_c <= extraout_XMM0_Da - 1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
  }
  Imath_3_2::Matrix33<float>::Matrix33(&local_84);
  local_88 = 0;
  while( true ) {
    uVar2 = local_88;
    uVar1 = Imath_3_2::Matrix33<float>::dimensions();
    if (uVar1 <= uVar2) break;
    local_8c = 0;
    while( true ) {
      in_stack_fffffffffffffef8 = local_8c;
      uVar2 = Imath_3_2::Matrix33<float>::dimensions();
      if (uVar2 <= in_stack_fffffffffffffef8) break;
      if (local_88 == local_8c) {
        pfVar5 = Imath_3_2::Vec3<float>::operator[](&local_3c,local_88);
        in_stack_fffffffffffffef4 = *pfVar5;
        pfVar5 = Imath_3_2::Matrix33<float>::operator[](&local_84,local_88);
        pfVar5[local_8c] = in_stack_fffffffffffffef4;
      }
      else {
        pfVar5 = Imath_3_2::Matrix33<float>::operator[](&local_84,local_88);
        pfVar5[local_8c] = 0.0;
      }
      local_8c = local_8c + 1;
    }
    local_88 = local_88 + 1;
  }
  pMVar6 = local_8;
  Imath_3_2::Matrix33<float>::determinant(local_8);
  std::abs((int)pMVar6);
  pMVar6 = &local_84;
  fVar7 = extraout_XMM0_Da_00;
  Imath_3_2::Matrix33<float>::determinant(pMVar6);
  std::abs((int)pMVar6);
  if (fVar7 - extraout_XMM0_Da_01 < local_c) {
    Imath_3_2::Matrix33<float>::operator*
              ((Matrix33<float> *)CONCAT44(uVar2,in_stack_fffffffffffffef8),
               (Matrix33<float> *)CONCAT44(in_stack_fffffffffffffef4,fVar7));
    Imath_3_2::Matrix33<float>::transposed
              ((Matrix33<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    Imath_3_2::Matrix33<float>::operator*
              ((Matrix33<float> *)CONCAT44(uVar2,in_stack_fffffffffffffef8),
               (Matrix33<float> *)CONCAT44(in_stack_fffffffffffffef4,fVar7));
    uVar2 = 0;
    do {
      uVar1 = uVar2;
      uVar3 = Imath_3_2::Matrix33<float>::dimensions();
      if (uVar3 <= uVar2) {
        return;
      }
      uVar2 = 0;
      while( true ) {
        uVar3 = uVar2;
        uVar4 = Imath_3_2::Matrix33<float>::dimensions();
        if (uVar4 <= uVar2) break;
        Imath_3_2::Matrix33<float>::operator[](local_8,uVar1);
        pMVar6 = &local_b0;
        Imath_3_2::Matrix33<float>::operator[](pMVar6,uVar1);
        std::abs((int)pMVar6);
        if (local_c <= extraout_XMM0_Da_02) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
        }
        uVar2 = uVar3 + 1;
      }
      uVar2 = uVar1 + 1;
    } while( true );
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}